

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O1

string * __thiscall
cmCTestSVN::SVNInfo::BuildLocalPath(string *__return_storage_ptr__,SVNInfo *this,string *path)

{
  ulong __n;
  int iVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((this->LocalPath)._M_string_length != 0) {
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)(this->LocalPath)._M_dataplus._M_p);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  __n = (this->Base)._M_string_length;
  if ((__n < path->_M_string_length) &&
     (iVar1 = strncmp((path->_M_dataplus)._M_p,(this->Base)._M_dataplus._M_p,__n), iVar1 == 0)) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)(path->_M_dataplus)._M_p);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestSVN::SVNInfo::BuildLocalPath(std::string const& path) const
{
  std::string local_path;

  // Add local path prefix if not empty
  if (!this->LocalPath.empty()) {
    local_path += this->LocalPath;
    local_path += "/";
  }

  // Add path with base prefix removed
  if (path.size() > this->Base.size() &&
      strncmp(path.c_str(), this->Base.c_str(), this->Base.size()) == 0) {
    local_path += (path.c_str() + this->Base.size());
  } else {
    local_path += path;
  }

  return local_path;
}